

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BlobCompare(Mem *pB1,Mem *pB2)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar4 = pB1->n;
  uVar2 = pB2->n;
  uVar1 = pB1->flags;
  if (((pB2->flags | uVar1) >> 0xe & 1) == 0) {
    uVar6 = uVar2;
    if ((int)uVar4 < (int)uVar2) {
      uVar6 = uVar4;
    }
    iVar3 = memcmp(pB1->z,pB2->z,(long)(int)uVar6);
    iVar5 = uVar4 - uVar2;
    if (iVar3 != 0) {
      iVar5 = iVar3;
    }
  }
  else {
    if ((uVar1 & 0x4000 & pB2->flags) == 0) {
      if ((uVar1 & 0x4000) != 0) {
        if (0 < (int)uVar2) {
          uVar7 = 0;
          do {
            if (pB2->z[uVar7] != '\0') {
              return -1;
            }
            uVar7 = uVar7 + 1;
          } while (uVar2 != uVar7);
        }
        return (pB1->u).nZero - uVar2;
      }
      if (0 < (int)uVar4) {
        uVar7 = 0;
        do {
          if (pB1->z[uVar7] != '\0') {
            return 1;
          }
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar7);
      }
    }
    else {
      uVar4 = (pB1->u).nZero;
    }
    iVar5 = uVar4 - (pB2->u).nZero;
  }
  return iVar5;
}

Assistant:

int sqlite3BlobCompare(const Mem *pB1, const Mem *pB2){
  int c;
  int n1 = pB1->n;
  int n2 = pB2->n;

  /* It is possible to have a Blob value that has some non-zero content
  ** followed by zero content.  But that only comes up for Blobs formed
  ** by the OP_MakeRecord opcode, and such Blobs never get passed into
  ** sqlite3MemCompare(). */
  assert( (pB1->flags & MEM_Zero)==0 || n1==0 );
  assert( (pB2->flags & MEM_Zero)==0 || n2==0 );

  if( (pB1->flags|pB2->flags) & MEM_Zero ){
    if( pB1->flags & pB2->flags & MEM_Zero ){
      return pB1->u.nZero - pB2->u.nZero;
    }else if( pB1->flags & MEM_Zero ){
      if( !isAllZero(pB2->z, pB2->n) ) return -1;
      return pB1->u.nZero - n2;
    }else{
      if( !isAllZero(pB1->z, pB1->n) ) return +1;
      return n1 - pB2->u.nZero;
    }
  }
  c = memcmp(pB1->z, pB2->z, n1>n2 ? n2 : n1);
  if( c ) return c;
  return n1 - n2;
}